

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

uint AddString(TidyPrintImpl *pprint,ctmbstr str)

{
  uint uVar1;
  uint uVar2;
  uint *extraout_RAX;
  ulong uVar4;
  uint len;
  uint *puVar3;
  
  uVar1 = pprint->linelen;
  uVar2 = prvTidytmbstrlen(str);
  puVar3 = (uint *)(ulong)uVar2;
  len = uVar2 + uVar1;
  if (pprint->lbufsize <= len) {
    expand(pprint,len);
    puVar3 = extraout_RAX;
  }
  if (uVar2 != 0) {
    puVar3 = pprint->linebuf;
    uVar4 = 0;
    do {
      puVar3[uVar1 + (int)uVar4] = (int)str[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  pprint->linelen = len;
  return (uint)puVar3;
}

Assistant:

static uint AddString( TidyPrintImpl* pprint, ctmbstr str )
{
   return pprint->linelen = AddAsciiString( pprint, str, pprint->linelen );
}